

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O0

int Sbd_CutComputeTruth(Sbd_Sto_t *p,Sbd_Cut_t *pCut0,Sbd_Cut_t *pCut1,int fCompl0,int fCompl1,
                       Sbd_Cut_t *pCutR,int fIsXor)

{
  uint uVar1;
  int nWords_00;
  uint uVar2;
  int iVar3;
  word *pIn;
  word *pIn_00;
  word *pTruth1;
  word *pTruth0;
  uint local_1c8;
  int nWords;
  int fCompl;
  int nCutSize;
  int truthId;
  int nOldSupp;
  word uTruth1 [16];
  word uTruth0 [16];
  word uTruth [16];
  Sbd_Cut_t *pCutR_local;
  int fCompl1_local;
  int fCompl0_local;
  Sbd_Cut_t *pCut1_local;
  Sbd_Cut_t *pCut0_local;
  Sbd_Sto_t *p_local;
  
  if (p->nCutSize < 7) {
    p_local._4_4_ = Sbd_CutComputeTruth6(p,pCut0,pCut1,fCompl0,fCompl1,pCutR,fIsXor);
  }
  else {
    uVar1 = *(uint *)&pCutR->field_0x14 >> 0x1c;
    iVar3 = p->nCutSize;
    nWords_00 = Abc_Truth6WordNum(iVar3);
    pIn = Sbd_CutTruth(p,pCut0);
    pIn_00 = Sbd_CutTruth(p,pCut1);
    uVar2 = Abc_LitIsCompl(pCut0->iFunc);
    Abc_TtCopy(uTruth1 + 0xf,pIn,nWords_00,uVar2 ^ fCompl0);
    uVar2 = Abc_LitIsCompl(pCut1->iFunc);
    Abc_TtCopy((word *)&truthId,pIn_00,nWords_00,uVar2 ^ fCompl1);
    Abc_TtExpand(uTruth1 + 0xf,iVar3,pCut0->pLeaves,*(uint *)&pCut0->field_0x14 >> 0x1c,
                 pCutR->pLeaves,*(uint *)&pCutR->field_0x14 >> 0x1c);
    Abc_TtExpand((word *)&truthId,iVar3,pCut1->pLeaves,*(uint *)&pCut1->field_0x14 >> 0x1c,
                 pCutR->pLeaves,*(uint *)&pCutR->field_0x14 >> 0x1c);
    if (fIsXor == 0) {
      local_1c8 = (uint)uTruth1[0xf] & truthId & 1;
      Abc_TtAnd(uTruth0 + 0xf,uTruth1 + 0xf,(word *)&truthId,nWords_00,local_1c8);
    }
    else {
      local_1c8 = ((uint)uTruth1[0xf] ^ truthId) & 1;
      Abc_TtXor(uTruth0 + 0xf,uTruth1 + 0xf,(word *)&truthId,nWords_00,local_1c8);
    }
    iVar3 = Abc_TtMinBase(uTruth0 + 0xf,pCutR->pLeaves,*(uint *)&pCutR->field_0x14 >> 0x1c,iVar3);
    *(uint *)&pCutR->field_0x14 = *(uint *)&pCutR->field_0x14 & 0xfffffff | iVar3 << 0x1c;
    if ((uTruth0[0xf] & 1) != 0) {
      __assert_fail("(uTruth[0] & 1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                    ,0x1a4,
                    "int Sbd_CutComputeTruth(Sbd_Sto_t *, Sbd_Cut_t *, Sbd_Cut_t *, int, int, Sbd_Cut_t *, int)"
                   );
    }
    iVar3 = Vec_MemHashInsert(p->vTtMem,uTruth0 + 0xf);
    iVar3 = Abc_Var2Lit(iVar3,local_1c8);
    pCutR->iFunc = iVar3;
    if (uVar1 < *(uint *)&pCutR->field_0x14 >> 0x1c) {
      __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut.c"
                    ,0x1a8,
                    "int Sbd_CutComputeTruth(Sbd_Sto_t *, Sbd_Cut_t *, Sbd_Cut_t *, int, int, Sbd_Cut_t *, int)"
                   );
    }
    p_local._4_4_ = (uint)(*(uint *)&pCutR->field_0x14 >> 0x1c < uVar1);
  }
  return p_local._4_4_;
}

Assistant:

static inline int Sbd_CutComputeTruth( Sbd_Sto_t * p, Sbd_Cut_t * pCut0, Sbd_Cut_t * pCut1, int fCompl0, int fCompl1, Sbd_Cut_t * pCutR, int fIsXor )
{
    if ( p->nCutSize <= 6 )
        return Sbd_CutComputeTruth6( p, pCut0, pCut1, fCompl0, fCompl1, pCutR, fIsXor );
    {
    word uTruth[SBD_MAX_TT_WORDS], uTruth0[SBD_MAX_TT_WORDS], uTruth1[SBD_MAX_TT_WORDS];
    int nOldSupp   = pCutR->nLeaves, truthId;
    int nCutSize   = p->nCutSize, fCompl;
    int nWords     = Abc_Truth6WordNum(nCutSize);
    word * pTruth0 = Sbd_CutTruth(p, pCut0);
    word * pTruth1 = Sbd_CutTruth(p, pCut1);
    Abc_TtCopy( uTruth0, pTruth0, nWords, Abc_LitIsCompl(pCut0->iFunc) ^ fCompl0 );
    Abc_TtCopy( uTruth1, pTruth1, nWords, Abc_LitIsCompl(pCut1->iFunc) ^ fCompl1 );
    Abc_TtExpand( uTruth0, nCutSize, pCut0->pLeaves, pCut0->nLeaves, pCutR->pLeaves, pCutR->nLeaves );
    Abc_TtExpand( uTruth1, nCutSize, pCut1->pLeaves, pCut1->nLeaves, pCutR->pLeaves, pCutR->nLeaves );
    if ( fIsXor )
        Abc_TtXor( uTruth, uTruth0, uTruth1, nWords, (fCompl = (int)((uTruth0[0] ^ uTruth1[0]) & 1)) );
    else
        Abc_TtAnd( uTruth, uTruth0, uTruth1, nWords, (fCompl = (int)((uTruth0[0] & uTruth1[0]) & 1)) );
    pCutR->nLeaves = Abc_TtMinBase( uTruth, pCutR->pLeaves, pCutR->nLeaves, nCutSize );
    assert( (uTruth[0] & 1) == 0 );
//Kit_DsdPrintFromTruth( uTruth, pCutR->nLeaves ), printf("\n" ), printf("\n" );
    truthId        = Vec_MemHashInsert(p->vTtMem, uTruth);
    pCutR->iFunc   = Abc_Var2Lit( truthId, fCompl );
    assert( (int)pCutR->nLeaves <= nOldSupp );
    return (int)pCutR->nLeaves < nOldSupp;
    }
}